

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICharReader.h
# Opt level: O1

void __thiscall ICharReader::ICharReader(ICharReader *this,ifstream *ifs,ostream *os,int deep)

{
  IAbstractReader::IAbstractReader(&this->super_IAbstractReader,ifs,os,deep,false);
  (this->super_IAbstractReader)._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00110b58;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_IAbstractReader).m_dataType,0,
             (char *)(this->super_IAbstractReader).m_dataType._M_string_length,0x10c234);
  return;
}

Assistant:

explicit ICharReader(std::ifstream* ifs,std::ostream* os,int deep) : IAbstractReader(ifs, os, deep) {
        m_dataType = "Char";
    }